

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Bytes __thiscall Omega_h::lor_each(Omega_h *this,Bytes *a,Bytes *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  int iVar4;
  int iVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  long lVar7;
  LO size_in;
  bool bVar8;
  Bytes BVar9;
  Write<signed_char> c;
  type f;
  Write<signed_char> local_e8;
  Write<signed_char> local_d8;
  undefined1 local_c8 [32];
  Alloc *local_a8;
  void *local_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  void *pvStack_70;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar4 = (int)pAVar2->size;
  }
  else {
    iVar4 = (int)((ulong)pAVar2 >> 3);
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    iVar5 = (int)pAVar3->size;
  }
  else {
    iVar5 = (int)((ulong)pAVar3 >> 3);
  }
  if (iVar4 == iVar5) {
    if (((ulong)pAVar2 & 1) == 0) {
      size_in = (LO)pAVar2->size;
    }
    else {
      size_in = (LO)((ulong)pAVar2 >> 3);
    }
    local_c8._0_8_ = (Alloc *)(local_c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
    Write<signed_char>::Write(&local_e8,size_in,(string *)local_c8);
    if ((Alloc *)local_c8._0_8_ != (Alloc *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
    }
    local_60 = local_e8.shared_alloc_.alloc;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60 = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58 = local_e8.shared_alloc_.direct_ptr;
    local_50 = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_48 = (a->write_).shared_alloc_.direct_ptr;
    local_40 = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40 = (Alloc *)(local_40->size * 8 + 1);
      }
      else {
        local_40->use_count = local_40->use_count + 1;
      }
    }
    local_38 = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_e8.shared_alloc_.alloc & 1) == 0) {
      iVar4 = (int)(local_e8.shared_alloc_.alloc)->size;
    }
    else {
      iVar4 = (int)((ulong)local_e8.shared_alloc_.alloc >> 3);
    }
    local_98 = local_60;
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_98 = (Alloc *)(local_60->size * 8 + 1);
      }
      else {
        local_60->use_count = local_60->use_count + 1;
      }
    }
    pvStack_90 = local_e8.shared_alloc_.direct_ptr;
    local_88 = local_50;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_78 = local_40;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78 = (Alloc *)(local_40->size * 8 + 1);
      }
      else {
        local_40->use_count = local_40->use_count + 1;
      }
    }
    pvStack_80 = local_48;
    pvStack_70 = local_38;
    if (0 < iVar4) {
      local_c8._8_8_ = local_e8.shared_alloc_.direct_ptr;
      local_c8._0_8_ = local_98;
      if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
        local_98->use_count = local_98->use_count + -1;
        local_c8._0_8_ = local_98->size * 8 + 1;
      }
      local_98 = (Alloc *)0x0;
      pvStack_90 = (void *)0x0;
      local_c8._16_8_ = local_88;
      if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
        local_88->use_count = local_88->use_count + -1;
        local_c8._16_8_ = local_88->size * 8 + 1;
      }
      local_88 = (Alloc *)0x0;
      pvStack_80 = (void *)0x0;
      local_a8 = local_78;
      if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
        local_78->use_count = local_78->use_count + -1;
        local_a8 = (Alloc *)(local_78->size * 8 + 1);
      }
      local_78 = (Alloc *)0x0;
      pvStack_70 = (void *)0x0;
      entering_parallel = '\0';
      lVar7 = 0;
      do {
        bVar8 = true;
        if (*(char *)((long)local_48 + lVar7) == '\0') {
          bVar8 = *(char *)((long)local_38 + lVar7) != '\0';
        }
        *(bool *)((long)local_e8.shared_alloc_.direct_ptr + lVar7) = bVar8;
        lVar7 = lVar7 + 1;
      } while (iVar4 != (int)lVar7);
      local_c8._24_8_ = local_48;
      local_a0 = local_38;
      lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_c8);
    }
    lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_98);
    local_d8.shared_alloc_.alloc = local_e8.shared_alloc_.alloc;
    local_d8.shared_alloc_.direct_ptr = local_e8.shared_alloc_.direct_ptr;
    if ((((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
         local_e8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_e8.shared_alloc_.alloc)->use_count = (local_e8.shared_alloc_.alloc)->use_count + -1;
      local_d8.shared_alloc_.alloc = (Alloc *)((local_e8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_e8.shared_alloc_.alloc = (Alloc *)0x0;
    local_e8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_d8);
    pAVar2 = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_60);
    pAVar2 = local_e8.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 &&
        local_e8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    BVar9.write_.shared_alloc_.direct_ptr = pvVar6;
    BVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x169);
}

Assistant:

Bytes lor_each(Bytes a, Bytes b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] || b[i]); };
  parallel_for(c.size(), f, "lor_each");
  return c;
}